

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl_sasl.c
# Opt level: O0

unsigned_short Curl_sasl_decode_mech(char *ptr,size_t maxlen,size_t *len)

{
  char cVar1;
  int iVar2;
  uint local_2c;
  char c;
  uint i;
  size_t *len_local;
  size_t maxlen_local;
  char *ptr_local;
  
  local_2c = 0;
  do {
    if (mechtable[local_2c].name == (char *)0x0) {
      return 0;
    }
    if ((mechtable[local_2c].len <= maxlen) &&
       (iVar2 = memcmp(ptr,mechtable[local_2c].name,mechtable[local_2c].len), iVar2 == 0)) {
      if (len != (size_t *)0x0) {
        *len = mechtable[local_2c].len;
      }
      if (maxlen == mechtable[local_2c].len) {
        return mechtable[local_2c].bit;
      }
      cVar1 = ptr[mechtable[local_2c].len];
      if ((((cVar1 < 'A') || ('Z' < cVar1)) && ((cVar1 < '0' || ('9' < cVar1)))) &&
         ((cVar1 != '-' && (cVar1 != '_')))) {
        return mechtable[local_2c].bit;
      }
    }
    local_2c = local_2c + 1;
  } while( true );
}

Assistant:

unsigned short Curl_sasl_decode_mech(const char *ptr, size_t maxlen,
                                     size_t *len)
{
  unsigned int i;
  char c;

  for(i = 0; mechtable[i].name; i++) {
    if(maxlen >= mechtable[i].len &&
       !memcmp(ptr, mechtable[i].name, mechtable[i].len)) {
      if(len)
        *len = mechtable[i].len;

      if(maxlen == mechtable[i].len)
        return mechtable[i].bit;

      c = ptr[mechtable[i].len];
      if(!ISUPPER(c) && !ISDIGIT(c) && c != '-' && c != '_')
        return mechtable[i].bit;
    }
  }

  return 0;
}